

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O2

char * UniqueObjectHelper<char*>(int index)

{
  size_type sVar1;
  bool bVar2;
  const_reference ppcVar3;
  ulong new_size;
  size_type i;
  char *local_80;
  table_element_adaptor<google::sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>
  local_78;
  char buffer [64];
  
  sVar1 = g_unique_charstar_objects.settings.table_size;
  do {
    new_size = sVar1;
    sVar1 = new_size * 2;
  } while ((int)new_size <= index);
  if (g_unique_charstar_objects.settings.table_size < new_size) {
    google::sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
    resize(&g_unique_charstar_objects,new_size);
  }
  i = (size_type)index;
  bVar2 = google::
          sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
          test(&g_unique_charstar_objects,i);
  if (!bVar2) {
    snprintf(buffer,0x40,"%d",index);
    local_80 = strdup(buffer);
    local_78.table = &g_unique_charstar_objects;
    local_78.pos = i;
    google::
    table_element_adaptor<google::sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>
    ::operator=(&local_78,&local_80);
  }
  ppcVar3 = google::
            sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
            get(&g_unique_charstar_objects,i);
  return *ppcVar3;
}

Assistant:

char* UniqueObjectHelper(int index) {
  // First grow the table if need be.
  sparsetable<char*>::size_type table_size = g_unique_charstar_objects.size();
  while (index >= static_cast<int>(table_size)) {
    assert(table_size * 2 > table_size);  // avoid overflow problems
    table_size *= 2;
  }
  if (table_size > g_unique_charstar_objects.size())
    g_unique_charstar_objects.resize(table_size);

  if (!g_unique_charstar_objects.test(index)) {
    char buffer[64];
    snprintf(buffer, sizeof(buffer), "%d", index);
    g_unique_charstar_objects[index] = strdup(buffer);
  }
  return g_unique_charstar_objects.get(index);
}